

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O0

uint arg_start(char *msg_)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *in_RDI;
  uint8_t *arg_pos;
  uint8_t *aligned_ptr;
  uint8_t *args;
  uint8_t *msg;
  char *local_28;
  
  pcVar2 = rtosc_argument_string(in_RDI);
  local_28 = pcVar2;
  do {
    pcVar3 = local_28 + 1;
    pcVar1 = local_28 + 1;
    local_28 = pcVar3;
  } while (*pcVar1 != '\0');
  return ((4 - (int)(((long)pcVar3 - (long)(pcVar2 + -1)) % 4)) + (int)pcVar3) - (int)in_RDI;
}

Assistant:

static unsigned arg_start(const char *msg_)
{
    const uint8_t *msg = (const uint8_t*)msg_;
    //Iterate to the right position
    const uint8_t *args = (const uint8_t*) rtosc_argument_string(msg_);
    const uint8_t *aligned_ptr = args-1;
    const uint8_t *arg_pos = args;

    while(*++arg_pos);
    //Alignment
    arg_pos += 4-(arg_pos-aligned_ptr)%4;
    return arg_pos-msg;
}